

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LeopardCommon.cpp
# Opt level: O0

void leopard::VectorXOR(uint64_t bytes,uint count,void **x,void **y)

{
  long in_RCX;
  uint in_ESI;
  void *in_RDI;
  uint i_1;
  int i;
  int i_end;
  uint64_t in_stack_000000f8;
  void *in_stack_00000100;
  void *in_stack_00000108;
  void *in_stack_00000440;
  void *in_stack_00000448;
  void *in_stack_00000450;
  void *in_stack_00000458;
  void *in_stack_00000460;
  void *in_stack_00000468;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  uint uVar1;
  undefined4 local_28;
  undefined4 local_c;
  
  local_c = in_ESI;
  if (3 < in_ESI) {
    for (local_28 = 0; local_28 <= (int)(in_ESI - 4); local_28 = local_28 + 4) {
      xor_mem4(in_stack_00000468,in_stack_00000460,in_stack_00000458,in_stack_00000450,
               in_stack_00000448,in_stack_00000440,*(void **)(in_RCX + (long)(local_28 + 3) * 8),
               in_RDI,CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    }
    local_c = in_ESI & 3;
  }
  for (uVar1 = 0; uVar1 < local_c; uVar1 = uVar1 + 1) {
    xor_mem(in_stack_00000108,in_stack_00000100,in_stack_000000f8);
  }
  return;
}

Assistant:

void VectorXOR(
    const uint64_t bytes,
    unsigned count,
    void** x,
    void** y)
{
#ifdef LEO_USE_VECTOR4_OPT
    if (count >= 4)
    {
        int i_end = count - 4;
        for (int i = 0; i <= i_end; i += 4)
        {
            xor_mem4(
                x[i + 0], y[i + 0],
                x[i + 1], y[i + 1],
                x[i + 2], y[i + 2],
                x[i + 3], y[i + 3],
                bytes);
        }
        count %= 4;
        i_end -= count;
        x += i_end;
        y += i_end;
    }
#endif // LEO_USE_VECTOR4_OPT

    for (unsigned i = 0; i < count; ++i)
        xor_mem(x[i], y[i], bytes);
}